

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int cmd_help(char *arg)

{
  int iVar1;
  char *__s;
  char *__s1;
  COMMAND *pCVar2;
  bool bVar3;
  
  __s = strdup(arg);
  strtok(__s," ");
  __s1 = strtok((char *)0x0," ");
  if (__s1 != (char *)0x0) {
    bVar3 = commands[0].name == (char *)0x0;
    if (!bVar3) {
      iVar1 = strcmp(__s1,commands[0].name);
      pCVar2 = commands;
      while (iVar1 != 0) {
        bVar3 = pCVar2[1].name == (char *)0x0;
        if (bVar3) goto LAB_0010a319;
        iVar1 = strcmp(__s1,pCVar2[1].name);
        pCVar2 = pCVar2 + 1;
      }
      if (!bVar3) {
        if (pCVar2->help_func == (_func_void *)0x0) {
          puts(pCVar2->helpstring);
        }
        else {
          (*pCVar2->help_func)();
        }
        goto LAB_0010a388;
      }
    }
LAB_0010a319:
    printf("Unknown command \'%s\'\n",__s1);
  }
  fwrite("Available commands:\n",0x14,1,_stdout);
  if (commands[0].name != (char *)0x0) {
    pCVar2 = commands;
    do {
      pCVar2 = pCVar2 + 1;
      if (pCVar2[-1].helpstring != (char *)0x0) {
        fprintf(_stdout,"  %-15s %s\n");
      }
    } while (pCVar2->name != (char *)0x0);
  }
LAB_0010a388:
  free(__s);
  return 0;
}

Assistant:

int
cmd_help(const char *arg)
{
    int i;
    char *args = strdup(arg);
    char *cmd = NULL;

    strtok(args, " ");
    if ((cmd = strtok(NULL, " ")) == NULL) {

generic_help:
        fprintf(stdout, "Available commands:\n");

        for (i = 0; commands[i].name; i++) {
            if (commands[i].helpstring != NULL) {
                fprintf(stdout, "  %-15s %s\n", commands[i].name, commands[i].helpstring);
            }
        }
    } else {
        /* print specific help for the selected command */

        /* get the command of the specified name */
        for (i = 0; commands[i].name; i++) {
            if (strcmp(cmd, commands[i].name) == 0) {
                break;
            }
        }

        /* execute the command's help if any valid command specified */
        if (commands[i].name) {
            if (commands[i].help_func != NULL) {
                commands[i].help_func();
            } else {
                printf("%s\n", commands[i].helpstring);
            }
        } else {
            /* if unknown command specified, print the list of commands */
            printf("Unknown command \'%s\'\n", cmd);
            goto generic_help;
        }
    }

    free(args);
    return 0;
}